

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_8x1_2t_pixels(uint16_t *src,__m256i *sig)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*in_RSI) [32];
  undefined8 *in_RDI;
  __m256i x0;
  __m256i r0;
  __m256i sf2;
  __m256i idx;
  
  uVar3 = *in_RDI;
  auVar2._8_8_ = uVar3;
  auVar2._0_8_ = uVar3;
  auVar2._16_8_ = uVar3;
  auVar2._24_8_ = uVar3;
  auVar1[8] = '\n';
  auVar1[9] = '\v';
  auVar1[10] = '\f';
  auVar1[0xb] = '\r';
  auVar1[0xc] = '\f';
  auVar1[0xd] = '\r';
  auVar1[0xe] = '\x0e';
  auVar1[0xf] = '\x0f';
  auVar1[0] = '\x06';
  auVar1[1] = '\a';
  auVar1[2] = '\b';
  auVar1[3] = '\t';
  auVar1[4] = '\b';
  auVar1[5] = '\t';
  auVar1[6] = '\n';
  auVar1[7] = '\v';
  auVar1[0x10] = '\x06';
  auVar1[0x11] = '\a';
  auVar1[0x12] = '\b';
  auVar1[0x13] = '\t';
  auVar1[0x14] = '\b';
  auVar1[0x15] = '\t';
  auVar1[0x16] = '\n';
  auVar1[0x17] = '\v';
  auVar1[0x18] = '\n';
  auVar1[0x19] = '\v';
  auVar1[0x1a] = '\f';
  auVar1[0x1b] = '\r';
  auVar1[0x1c] = '\f';
  auVar1[0x1d] = '\r';
  auVar1[0x1e] = '\x0e';
  auVar1[0x1f] = '\x0f';
  auVar1 = vpshufb_avx2(auVar2,auVar1);
  auVar6._8_8_ = uVar3;
  auVar6._0_8_ = uVar3;
  auVar6._16_8_ = uVar3;
  auVar6._24_8_ = uVar3;
  auVar5._8_4_ = 4;
  auVar5._12_4_ = 5;
  auVar5._0_4_ = 2;
  auVar5._4_4_ = 3;
  auVar5._16_4_ = 2;
  auVar5._20_4_ = 3;
  auVar5._24_4_ = 4;
  auVar5._28_4_ = 5;
  auVar2 = vpermd_avx2(auVar5,auVar6);
  auVar4[8] = '\n';
  auVar4[9] = '\v';
  auVar4[10] = '\f';
  auVar4[0xb] = '\r';
  auVar4[0xc] = '\f';
  auVar4[0xd] = '\r';
  auVar4[0xe] = '\x0e';
  auVar4[0xf] = '\x0f';
  auVar4[0] = '\x06';
  auVar4[1] = '\a';
  auVar4[2] = '\b';
  auVar4[3] = '\t';
  auVar4[4] = '\b';
  auVar4[5] = '\t';
  auVar4[6] = '\n';
  auVar4[7] = '\v';
  auVar4[0x10] = '\x06';
  auVar4[0x11] = '\a';
  auVar4[0x12] = '\b';
  auVar4[0x13] = '\t';
  auVar4[0x14] = '\b';
  auVar4[0x15] = '\t';
  auVar4[0x16] = '\n';
  auVar4[0x17] = '\v';
  auVar4[0x18] = '\n';
  auVar4[0x19] = '\v';
  auVar4[0x1a] = '\f';
  auVar4[0x1b] = '\r';
  auVar4[0x1c] = '\f';
  auVar4[0x1d] = '\r';
  auVar4[0x1e] = '\x0e';
  auVar4[0x1f] = '\x0f';
  auVar2 = vpshufb_avx2(auVar2,auVar4);
  auVar1 = vperm2i128_avx2(auVar1,auVar2,0x20);
  *in_RSI = auVar1;
  return;
}

Assistant:

static inline void pack_8x1_2t_pixels(const uint16_t *src,
                                      __m256i *sig /*sig[2]*/) {
  const __m256i idx = _mm256_loadu_si256((const __m256i *)signal_index);
  const __m256i sf2 = _mm256_loadu_si256((const __m256i *)signal_pattern_2);
  __m256i r0 = _mm256_loadu_si256((const __m256i *)src);
  __m256i x0 = _mm256_shuffle_epi8(r0, sf2);
  r0 = _mm256_permutevar8x32_epi32(r0, idx);
  r0 = _mm256_shuffle_epi8(r0, sf2);
  sig[0] = _mm256_permute2x128_si256(x0, r0, 0x20);
}